

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_logic(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  long lVar1;
  TCGv_i64 pTVar2;
  
  if ((rd == 0) || (3 < opc - 0x24)) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  switch(opc) {
  case 0x24:
    pTVar2 = tcg_ctx->cpu_gpr[rd];
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_and_i64_mips64el(tcg_ctx,pTVar2,tcg_ctx->cpu_gpr[rs],tcg_ctx->cpu_gpr[rt]);
      return;
    }
    goto LAB_008751d0;
  case 0x25:
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_or_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rs],tcg_ctx->cpu_gpr[rt]);
      return;
    }
    break;
  case 0x26:
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_xor_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rs],tcg_ctx->cpu_gpr[rt]);
      return;
    }
    break;
  case 0x27:
    if (rt != 0 && rs != 0) {
      tcg_gen_nor_i64_mips64el
                (tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rs],tcg_ctx->cpu_gpr[rt]);
      return;
    }
    if (rs == 0 && rt != 0) {
      pTVar2 = tcg_ctx->cpu_gpr[rd];
      lVar1 = (long)rt;
    }
    else {
      pTVar2 = tcg_ctx->cpu_gpr[rd];
      if (rt != 0 || rs == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar2,-1);
        return;
      }
      lVar1 = (long)rs;
    }
    tcg_gen_not_i64_mips64el(tcg_ctx,pTVar2,tcg_ctx->cpu_gpr[lVar1]);
    return;
  }
  if (rs == 0 && rt != 0) {
    pTVar2 = tcg_ctx->cpu_gpr[rd];
    lVar1 = (long)rt;
  }
  else {
    pTVar2 = tcg_ctx->cpu_gpr[rd];
    if (rt != 0 || rs == 0) {
LAB_008751d0:
      tcg_gen_movi_i64_mips64el(tcg_ctx,pTVar2,0);
      return;
    }
    lVar1 = (long)rs;
  }
  tcg_gen_mov_i64_mips64el(tcg_ctx,pTVar2,tcg_ctx->cpu_gpr[lVar1]);
  return;
}

Assistant:

static void gen_logic(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    switch (opc) {
    case OPC_AND:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_NOR:
        if (rs != 0 && rt != 0) {
            tcg_gen_nor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], ~((target_ulong)0));
        }
        break;
    case OPC_OR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_XOR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}